

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int balloc(bstring b,int len)

{
  int iVar1;
  uchar *local_28;
  uchar *x;
  int len_local;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen < 0)) ||
     (((b->mlen < 1 || (b->mlen < b->slen)) || (len < 1)))) {
    b_local._4_4_ = -1;
  }
  else {
    if (b->mlen <= len) {
      iVar1 = snapUpSize(len);
      if (iVar1 <= b->mlen) {
        return 0;
      }
      if (b->mlen * 7 < b->slen * 8) {
        local_28 = (uchar *)realloc(b->data,(long)iVar1);
        if (local_28 == (uchar *)0x0) {
          return -1;
        }
      }
      else {
        local_28 = (uchar *)malloc((long)iVar1);
        if (local_28 == (uchar *)0x0) {
          local_28 = (uchar *)realloc(b->data,(long)iVar1);
          if (local_28 == (uchar *)0x0) {
            return -1;
          }
        }
        else {
          if (b->slen != 0) {
            memcpy(local_28,b->data,(long)b->slen);
          }
          free(b->data);
        }
      }
      b->data = local_28;
      b->mlen = iVar1;
      b->data[b->slen] = '\0';
    }
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int balloc (bstring b, int len) {
	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen <= 0 || 
	    b->mlen < b->slen || len <= 0) {
		return BSTR_ERR;
	}

	if (len >= b->mlen) {
		unsigned char * x;

		if ((len = snapUpSize (len)) <= b->mlen) return BSTR_OK;

		/* Assume probability of a non-moving realloc is 0.125 */
		if (7 * b->mlen < 8 * b->slen) {

			/* If slen is close to mlen in size then use realloc to reduce
			   the memory defragmentation */

			x = (unsigned char *) bstr__realloc (b->data, len);
			if (x == NULL) return BSTR_ERR;
		} else {

			/* If slen is not close to mlen then avoid the penalty of copying
			   the extra bytes that are allocated, but not considered part of
			   the string */

			x = (unsigned char *) bstr__alloc (len);
			if (x == NULL) {
				x = (unsigned char *) bstr__realloc (b->data, len);
				if (x == NULL) return BSTR_ERR;
			} else {
				if (b->slen) bstr__memcpy ((char *) x, (char *) b->data, b->slen);
				bstr__free (b->data);
			}
		}
		b->data = x;
		b->mlen = len;
		b->data[b->slen] = (unsigned char) '\0';
	}

	return BSTR_OK;
}